

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  string *psVar1;
  PlatformInterface *pPVar2;
  char *pcVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  VkAllocationCallbacks *pVVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  deUint32 dVar11;
  uint numPassingAllocs;
  ulong uVar12;
  uint uVar13;
  Environment rootEnv;
  Environment objEnv;
  Resources res;
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  DeterministicFailAllocator objAllocator;
  EnvClone resEnv;
  Environment local_a48;
  Environment local_a10;
  Resources local_9d8;
  undefined1 local_9a8 [8];
  Deleter<vk::Handle<(vk::HandleType)16>_> aDStack_9a0 [4];
  ios_base local_930 [264];
  Move<vk::Handle<(vk::HandleType)16>_> local_828;
  AllocationCallbackRecorder local_800;
  AllocationCallbackRecorder local_7a0;
  DeterministicFailAllocator local_740;
  EnvClone local_6f0;
  
  pVVar7 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7a0,pVVar7,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar8 = Context::getDeviceInterface(context);
  pVVar9 = Context::getDevice(context);
  local_a48.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_a48.programBinaries = context->m_progCollection;
  local_a48.allocationCallbacks =
       &local_7a0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a48.maxResourceConsumers = 1;
  local_a48.vkp = pPVar2;
  local_a48.vkd = pDVar8;
  local_a48.device = pVVar9;
  dVar5 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  dVar11 = 0x400;
  if (dVar5 != 0) {
    dVar11 = dVar5;
  }
  iVar6 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_9a8 = (undefined1  [8])((ulong)(iVar6 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6f0,&local_a48,(Parameters *)local_9a8,iVar6 - 1U);
  PipelineLayout::Resources::Resources(&local_9d8,&local_6f0.env,params);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar10 = &(__return_storage_ptr__->m_description).field_2;
  uVar13 = dVar11 + (dVar11 == 0);
  uVar12 = 0;
  while( true ) {
    pVVar7 = ::vk::getSystemAllocator();
    numPassingAllocs = (uint)uVar12;
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_740,pVVar7,MODE_COUNT_AND_FAIL,numPassingAllocs);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_800,&local_740.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    local_a10.vkp = local_6f0.env.vkp;
    local_a10.vkd = local_6f0.env.vkd;
    local_a10.device = local_6f0.env.device;
    local_a10.queueFamilyIndex = local_6f0.env.queueFamilyIndex;
    local_a10.programBinaries = local_6f0.env.programBinaries;
    local_a10.allocationCallbacks =
         &local_800.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_a10.maxResourceConsumers = local_6f0.env.maxResourceConsumers;
    local_9a8 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_9a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_9a0,"Trying to create object with ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)aDStack_9a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_9a0," allocation",0xb);
    pcVar3 = ",\n\t\t";
    if (uVar12 != 1) {
      pcVar3 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_9a0,pcVar3 + 4,(ulong)(uVar12 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_9a0," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_9a0);
    std::ios_base::~ios_base(local_930);
    PipelineLayout::create(&local_828,&local_a10,&local_9d8,params);
    aDStack_9a0[0].m_device =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
    aDStack_9a0[0].m_allocator =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
    local_9a8 = (undefined1  [8])
                local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
    aDStack_9a0[0].m_deviceIface =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
    if (local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                (aDStack_9a0,
                 (VkPipelineLayout)
                 local_828.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
    }
    bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_800,0);
    if (bVar4) {
      local_9a8 = (undefined1  [8])context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_9a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aDStack_9a0,"Object construction succeeded! ",0x1f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_9a0);
      std::ios_base::~ios_base(local_930);
      iVar6 = 2;
    }
    else {
      local_9a8 = (undefined1  [8])&aDStack_9a0[0].m_device;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9a8,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_9a8,
                 (long)local_9a8 + (long)&(aDStack_9a0[0].m_deviceIface)->_vptr_DeviceInterface);
      if (local_9a8 != (undefined1  [8])&aDStack_9a0[0].m_device) {
        operator_delete((void *)local_9a8,(ulong)(aDStack_9a0[0].m_device + 1));
      }
      iVar6 = 1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_800);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_740.super_ChainedAllocator);
    if (iVar6 != 0) break;
    uVar12 = uVar12 + 1;
    if (uVar13 == uVar12) {
      bVar4 = true;
      numPassingAllocs = uVar13;
LAB_00400737:
      if (local_9d8.pSetLayouts.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_9d8.pSetLayouts.
                        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_9d8.pSetLayouts.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_9d8.pSetLayouts.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ::~vector(&local_9d8.descriptorSetLayouts);
      ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
      if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
      if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      if (bVar4) {
        bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7a0,0);
        if (bVar4) {
          if (numPassingAllocs == 0) {
            local_6f0.deviceRes.instance._0_8_ =
                 &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                  deleter;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6f0,"Allocation callbacks not called","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
          else if (numPassingAllocs == dVar11) {
            local_6f0.deviceRes.instance._0_8_ =
                 &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                  deleter;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6f0,"Max iter count reached; OOM testing incomplete","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_COMPATIBILITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
          else {
            local_6f0.deviceRes.instance._0_8_ =
                 &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                  deleter;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"Ok","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
        }
        else {
          local_6f0.deviceRes.instance._0_8_ =
               &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6f0,"Invalid allocation callback","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                     local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                     object + local_6f0.deviceRes.instance._0_8_);
        }
        if ((Deleter<vk::VkInstance_s_*> *)local_6f0.deviceRes.instance._0_8_ !=
            &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter) {
          operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                          (ulong)(local_6f0.deviceRes.instance.object.
                                  super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance
                                 + 1));
        }
      }
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7a0);
      return __return_storage_ptr__;
    }
  }
  bVar4 = iVar6 == 2;
  goto LAB_00400737;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}